

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseRows(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Parsekey PVar4;
  char *start_00;
  char *pcVar5;
  undefined8 uVar6;
  string *psVar7;
  ulong uVar8;
  pointer ppVar9;
  size_type sVar10;
  HighsLogOptions *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar11;
  iterator mit;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  ret;
  string name;
  size_t rowname_end;
  string rowname;
  string unidentified;
  Parsekey key;
  size_t end;
  size_t start;
  bool isFreeRow;
  bool isobj;
  bool skip;
  bool hasobj;
  string word;
  string strline;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  size_t in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  string local_150 [32];
  size_t local_130;
  string *in_stack_fffffffffffffed8;
  size_t *in_stack_fffffffffffffee0;
  size_t *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  HMpsFF *in_stack_fffffffffffffef8;
  bool local_7d;
  int local_7c;
  byte local_75;
  string local_60 [32];
  string local_40 [40];
  HighsLogOptions *local_18;
  Parsekey local_4;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  bVar1 = false;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x268),"Objective");
  do {
    do {
      bVar2 = getMpsLine((HMpsFF *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (istream *)in_stack_fffffffffffffde0._M_cur,
                         (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                         (bool *)in_stack_fffffffffffffdd0._M_cur);
      if (!bVar2) {
        highsLogUser(local_18,kError,"Anomalous exit when parsing BOUNDS section of MPS file\n");
        sVar10 = std::vector<double,_std::allocator<double>_>::size
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe8));
        *(int *)(in_RDI + 0x18) = (int)sVar10;
        local_4 = kFail;
        PVar4 = local_4;
        goto LAB_0045e8c1;
      }
    } while ((local_75 & 1) != 0);
    bVar2 = timeout((HMpsFF *)in_stack_fffffffffffffdd0._M_cur);
    if (bVar2) {
      local_4 = kTimeout;
      PVar4 = local_4;
      break;
    }
    local_7d = false;
    bVar2 = false;
    PVar4 = checkFirstWord(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8);
    if (PVar4 != kNone) {
      highsLogDev(local_18,kInfo,"readMPS: Read ROWS    OK\n");
      if (!bVar1) {
        *(undefined1 *)(in_RDI + 8) = 1;
        highsLogUser(local_18,kWarning,"No objective row found\n");
        std::
        unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::emplace<char_const(&)[27],int>
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffde0._M_cur,
                   (char (*) [27])CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                   (int *)in_stack_fffffffffffffdd0._M_cur);
      }
      break;
    }
    start_00 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*start_00 == 'G') {
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_cur,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0._M_cur,
                 (value_type_conflict1 *)
                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      std::
      vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
      ::push_back((vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                   *)in_stack_fffffffffffffdd0._M_cur,
                  (value_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      if (*pcVar5 == 'E') {
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_cur,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_cur,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        std::
        vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
        ::push_back((vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                     *)in_stack_fffffffffffffdd0._M_cur,
                    (value_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        if (*pcVar5 == 'L') {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_cur,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_cur,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          std::
          vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
          ::push_back((vector<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                       *)in_stack_fffffffffffffdd0._M_cur,
                      (value_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        }
        else {
          in_stack_fffffffffffffe28 = (string *)std::__cxx11::string::operator[]((ulong)local_40);
          if (in_stack_fffffffffffffe28->_M_dataplus != (_Alloc_hider)0x4e) {
            std::__cxx11::string::substr((ulong)&stack0xfffffffffffffef8,(ulong)local_40);
            trim((string *)in_stack_fffffffffffffdd0._M_cur,
                 (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            uVar6 = std::__cxx11::string::c_str();
            highsLogUser(local_18,kError,
                         "Entry \"%s\" in ROWS section of MPS file is unidentified\n",uVar6);
            local_4 = kFail;
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
            PVar4 = local_4;
            break;
          }
          bVar3 = bVar1;
          if (!bVar1) {
            *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(in_RDI + 0x18);
            bVar3 = true;
          }
          local_7d = !bVar1;
          bVar2 = bVar1;
          bVar1 = bVar3;
        }
      }
    }
    first_word((string *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (size_t)start_00);
    local_130 = first_word_end(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    bVar3 = is_end((string *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (size_t)in_stack_fffffffffffffde0._M_cur,
                   (string *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    if (bVar3) {
      if (bVar2) {
        std::
        unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::emplace<std::__cxx11::string&,int>
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffde0._M_cur,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                   (int *)in_stack_fffffffffffffdd0._M_cur);
        local_7c = 2;
      }
      else {
        if (local_7d) {
          in_stack_fffffffffffffdec = -1;
        }
        else {
          in_stack_fffffffffffffdec = *(int *)(in_RDI + 0x18);
          *(int *)(in_RDI + 0x18) = in_stack_fffffffffffffdec + 1;
        }
        pVar11 = std::
                 unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::emplace<std::__cxx11::string&,int>
                           ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)in_stack_fffffffffffffde0._M_cur,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                            (int *)in_stack_fffffffffffffdd0._M_cur);
        in_stack_fffffffffffffde0._M_cur =
             (__node_type *)
             pVar11.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
             ._M_cur;
        in_stack_fffffffffffffddf = pVar11.second;
        if (local_7d) {
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x268),(string *)&stack0xfffffffffffffed8);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffde0._M_cur,
                      (value_type *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        }
        if ((((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           ((*(byte *)(in_RDI + 0x1dc) & 1) == 0)) {
          *(undefined1 *)(in_RDI + 0x1dc) = 1;
          in_stack_fffffffffffffdd0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                      (key_type *)0x45e7bf);
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x1e0),(string *)&stack0xfffffffffffffed8);
          ppVar9 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                 *)0x45e7fe);
          *(int *)(in_RDI + 0x200) = ppVar9->second;
          *(int *)(in_RDI + 0x204) = *(int *)(in_RDI + 0x18) + -1;
        }
        local_7c = 0;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)local_150,(ulong)local_40);
      psVar7 = trim((string *)in_stack_fffffffffffffdd0._M_cur,
                    (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      std::__cxx11::string::operator=(local_150,(string *)psVar7);
      uVar8 = std::__cxx11::string::size();
      if (uVar8 < 9) {
        local_4 = kFixedFormat;
      }
      else {
        local_4 = kFail;
      }
      local_7c = 1;
      std::__cxx11::string::~string(local_150);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    in_stack_fffffffffffffdcc = local_7c;
  } while ((local_7c == 0) || (PVar4 = local_4, local_7c == 2));
LAB_0045e8c1:
  local_4 = PVar4;
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRows(const HighsLogOptions& log_options,
                                   std::istream& file) {
  std::string strline, word;
  bool hasobj = false;
  // Assign a default objective name
  objective_name = "Objective";

  assert(num_row == 0);
  assert(row_lower.size() == 0);
  assert(row_upper.size() == 0);
  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    bool isobj = false;
    bool isFreeRow = false;

    size_t start = 0;
    size_t end = 0;

    HMpsFF::Parsekey key = checkFirstWord(strline, start, end, word);

    // start of new section?
    if (key != HMpsFF::Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read ROWS    OK\n");
      if (!hasobj) {
        warning_issued_ = true;
        highsLogUser(log_options, HighsLogType::kWarning,
                     "No objective row found\n");
        rowname2idx.emplace("artificial_empty_objective", -1);
      };
      return key;
    }

    if (strline[start] == 'G') {
      row_lower.push_back(0.0);
      row_upper.push_back(kHighsInf);
      row_type.push_back(Boundtype::kGe);
    } else if (strline[start] == 'E') {
      row_lower.push_back(0.0);
      row_upper.push_back(0.0);
      row_type.push_back(Boundtype::kEq);
    } else if (strline[start] == 'L') {
      row_lower.push_back(-kHighsInf);
      row_upper.push_back(0.0);
      row_type.push_back(Boundtype::kLe);
    } else if (strline[start] == 'N') {
      if (!hasobj) {
        isobj = true;
        hasobj = true;
        cost_row_location = num_row;
      } else {
        isFreeRow = true;
      }
    } else {
      std::string unidentified = strline.substr(start);
      trim(unidentified);
      highsLogUser(log_options, HighsLogType::kError,
                   "Entry \"%s\" in ROWS section of MPS file is unidentified\n",
                   unidentified.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    std::string rowname = first_word(strline, start + 1);
    size_t rowname_end = first_word_end(strline, start + 1);

    // Detect if file is in fixed format.
    if (!is_end(strline, rowname_end)) {
      std::string name = strline.substr(start + 1);
      name = trim(name);
      if (name.size() > 8)
        return HMpsFF::Parsekey::kFail;
      else
        return HMpsFF::Parsekey::kFixedFormat;
    }

    // Do not add to matrix if row is free.
    if (isFreeRow) {
      rowname2idx.emplace(rowname, -2);
      continue;
    }

    // so in rowname2idx -1 is the objective, -2 is all the free rows
    auto ret = rowname2idx.emplace(rowname, isobj ? (-1) : (num_row++));
    // ret is a pair consisting of an iterator to the inserted
    // element (or the already-existing element if no insertion
    // happened) and a bool denoting whether the insertion took place

    // Else is enough here because all free rows are ignored.
    if (!isobj)
      row_names.push_back(rowname);
    else
      objective_name = rowname;

    if (!ret.second) {
      // Duplicate row name
      if (!has_duplicate_row_name_) {
        // This is the first so record it
        has_duplicate_row_name_ = true;
        auto mit = rowname2idx.find(rowname);
        assert(mit != rowname2idx.end());
        duplicate_row_name_ = rowname;
        duplicate_row_name_index0_ = mit->second;
        duplicate_row_name_index1_ = num_row - 1;
      }
    }
  }

  // Hard to imagine how the following lines are executed
  highsLogUser(log_options, HighsLogType::kError,
               "Anomalous exit when parsing BOUNDS section of MPS file\n");
  assert(1 == 0);
  // Update num_row in case there is free rows. They won't be added to the
  // constraint matrix.
  num_row = row_lower.size();
  return HMpsFF::Parsekey::kFail;
}